

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::assertType(QPDFObjectHandle *this,char *type_name,bool istype)

{
  runtime_error *this_00;
  char *__rhs;
  QPDFObjectHandle local_c8 [2];
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  char *pcStack_18;
  bool istype_local;
  char *type_name_local;
  QPDFObjectHandle *this_local;
  
  if (!istype) {
    local_19 = istype;
    pcStack_18 = type_name;
    type_name_local = (char *)this;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"operation for ",&local_a1);
    std::operator+(&local_80,&local_a0,pcStack_18);
    std::operator+(&local_60,&local_80," attempted on object of type ");
    QPDFObjectHandle(local_c8,this);
    __rhs = getTypeName(local_c8);
    std::operator+(&local_40,&local_60,__rhs);
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::assertType(char const* type_name, bool istype) const
{
    if (!istype) {
        throw std::runtime_error(
            std::string("operation for ") + type_name + " attempted on object of type " +
            QPDFObjectHandle(*this).getTypeName());
    }
}